

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

int __thiscall Thread::join(Thread *this)

{
  int iVar1;
  byte *in_RDI;
  
  if ((*in_RDI & 1) == 0) {
    __assert_fail("started_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/Thread.cpp"
                  ,0x60,"int Thread::join()");
  }
  if (((in_RDI[1] ^ 0xff) & 1) == 0) {
    __assert_fail("!joined_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/Thread.cpp"
                  ,0x61,"int Thread::join()");
  }
  in_RDI[1] = 1;
  iVar1 = pthread_join(*(pthread_t *)(in_RDI + 8),(void **)0x0);
  return iVar1;
}

Assistant:

int Thread::join(){
    assert(started_);
    assert(!joined_);
    joined_=true;
    return pthread_join(pthreadId_, nullptr);
}